

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O2

int methodIndexToSignalIndex(QMetaObject **base,int signal_index)

{
  int iVar1;
  QMetaObject *this;
  long in_FS_OFFSET;
  int methodOffset;
  int signalOffset;
  int local_30;
  int local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this = (QMetaObject *)base;
  if (-1 < signal_index) {
    do {
      this = (this->d).superdata.direct;
      if (this == (QMetaObject *)0x0) goto LAB_0028d640;
      iVar1 = QMetaObject::methodOffset(this);
    } while (signal_index < iVar1);
    local_2c = -0x55555556;
    local_30 = -0x55555556;
    computeOffsets(this,&local_2c,&local_30);
    iVar1 = QMetaObject::methodCount(this);
    if (signal_index < iVar1) {
      iVar1 = QMetaObjectPrivate::originalClone(this,signal_index - local_30);
      signal_index = iVar1 + local_2c;
    }
    else {
      signal_index = (signal_index - local_30) + local_2c;
    }
    *base = this;
  }
LAB_0028d640:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return signal_index;
}

Assistant:

static int methodIndexToSignalIndex(const QMetaObject **base, int signal_index)
{
    if (signal_index < 0)
        return signal_index;
    const QMetaObject *metaObject = *base;
    while (metaObject && metaObject->methodOffset() > signal_index)
        metaObject = metaObject->superClass();

    if (metaObject) {
        int signalOffset, methodOffset;
        computeOffsets(metaObject, &signalOffset, &methodOffset);
        if (signal_index < metaObject->methodCount())
            signal_index = QMetaObjectPrivate::originalClone(metaObject, signal_index - methodOffset) + signalOffset;
        else
            signal_index = signal_index - methodOffset + signalOffset;
        *base = metaObject;
    }
    return signal_index;
}